

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_interface.h
# Opt level: O0

void katherine_cmd_long(char *cmd,long value)

{
  int mmsb;
  int mlsb;
  int i;
  long value_local;
  char *cmd_local;
  
  mmsb = 0;
  for (_mlsb = value; 0 < _mlsb; _mlsb = (_mlsb / 0x10) / 0x10) {
    cmd[mmsb] = (byte)(_mlsb % 0x10) & 0xf | (byte)(((uint)((_mlsb / 0x10) % 0x10) & 0xf) << 4);
    mmsb = mmsb + 1;
  }
  return;
}

Assistant:

static inline void
katherine_cmd_long(char *cmd, long value)
{
    int i = 0;
    int mlsb, mmsb;
    while (value > 0) {
        mlsb = (0x0f) & (int) (value % 16);
        value /= 16;

        mmsb = (0x0f) & (int) (value % 16);
        value /= 16;

        cmd[i++] = (char) ((0xff & mlsb) | (0xff & mmsb) << 4);
    }
}